

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O3

bool Omega_h::intersects<int>
               (set<int,_std::less<int>,_std::allocator<int>_> *a,
               set<int,_std::less<int>,_std::allocator<int>_> *b)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  
  p_Var3 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(b->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    p_Var2 = (a->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &(a->_M_t)._M_impl.super__Rb_tree_header;
    do {
      if (p_Var2 != (_Base_ptr)0x0) {
        _Var1 = p_Var3[1]._M_color;
        p_Var4 = &p_Var7->_M_header;
        p_Var6 = p_Var2;
        do {
          if ((int)_Var1 <= (int)p_Var6[1]._M_color) {
            p_Var4 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)_Var1];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var4 != p_Var7) && ((int)p_Var4[1]._M_color <= (int)_Var1)) {
          return true;
        }
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return false;
}

Assistant:

bool intersects(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) {
    auto it = a.find(x);
    if (it != a.end()) return true;
  }
  return false;
}